

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall QTreeView::setSelection(QTreeView *this,QRect *rect,SelectionFlags command)

{
  bool bVar1;
  Int IVar2;
  QTreeViewPrivate *this_00;
  QItemSelectionModel *pQVar3;
  int *piVar4;
  QTreeViewItem *pQVar5;
  uint in_EDX;
  long *in_RDI;
  fd_set *in_R8;
  timeval *in_R9;
  long in_FS_OFFSET;
  int column;
  QTreeViewPrivate *d;
  QModelIndex index;
  QModelIndex bottomRight;
  QModelIndex topLeft;
  QPoint br;
  QPoint tl;
  int in_stack_fffffffffffffef8;
  SelectionFlag in_stack_fffffffffffffefc;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff00;
  int acolumn;
  int arow;
  int iVar6;
  int iVar7;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_90;
  QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4> local_84;
  fd_set local_80;
  
  local_80.fds_bits[0xf] = *(long *)(in_FS_OFFSET + 0x28);
  local_80.fds_bits[0xe]._4_4_ = in_EDX;
  this_00 = d_func((QTreeView *)0x8fc59c);
  pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff00);
  if ((pQVar3 != (QItemSelectionModel *)0x0) &&
     (bVar1 = QRect::isNull((QRect *)in_stack_ffffffffffffff00), !bVar1)) {
    QAbstractItemViewPrivate::executePostedLayout(in_stack_ffffffffffffff00);
    local_80.fds_bits._108_8_ = &DAT_aaaaaaaaaaaaaaaa;
    bVar1 = QWidget::isRightToLeft((QWidget *)0x8fc5e9);
    if (bVar1) {
      local_80.fds_bits[0xd]._0_4_ = QRect::left((QRect *)0x8fc5f9);
      local_80.fds_bits[0xc]._4_4_ = QRect::right((QRect *)0x8fc60a);
      piVar4 = qMax<int>((int *)(local_80.fds_bits + 0xd),(int *)((long)local_80.fds_bits + 100));
      iVar6 = *piVar4;
    }
    else {
      local_80.fds_bits[0xc]._0_4_ = QRect::left((QRect *)0x8fc638);
      local_80.fds_bits[0xb]._4_4_ = QRect::right((QRect *)0x8fc649);
      piVar4 = qMin<int>((int *)(local_80.fds_bits + 0xc),(int *)((long)local_80.fds_bits + 0x5c));
      iVar6 = *piVar4;
    }
    iVar7 = iVar6;
    local_80.fds_bits[0xb]._0_4_ = QRect::top((QRect *)0x8fc67d);
    local_80.fds_bits[10]._4_4_ = QRect::bottom((QRect *)0x8fc68e);
    qMin<int>((int *)(local_80.fds_bits + 0xb),(int *)((long)local_80.fds_bits + 0x54));
    QPoint::QPoint((QPoint *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                   in_stack_fffffffffffffef8);
    local_80.fds_bits._76_8_ = &DAT_aaaaaaaaaaaaaaaa;
    bVar1 = QWidget::isRightToLeft((QWidget *)0x8fc6d6);
    if (bVar1) {
      local_80.fds_bits[9]._0_4_ = QRect::left((QRect *)0x8fc6e6);
      local_80.fds_bits[8]._4_4_ = QRect::right((QRect *)0x8fc6f7);
      piVar4 = qMin<int>((int *)(local_80.fds_bits + 9),(int *)((long)local_80.fds_bits + 0x44));
      acolumn = *piVar4;
    }
    else {
      local_80.fds_bits[8]._0_4_ = QRect::left((QRect *)0x8fc725);
      local_80.fds_bits[7]._4_4_ = QRect::right((QRect *)0x8fc736);
      piVar4 = qMax<int>((int *)(local_80.fds_bits + 8),(int *)((long)local_80.fds_bits + 0x3c));
      acolumn = *piVar4;
    }
    arow = acolumn;
    local_80.fds_bits[7]._0_4_ = QRect::top((QRect *)0x8fc76a);
    local_80.fds_bits[6]._4_4_ = QRect::bottom((QRect *)0x8fc77b);
    qMax<int>((int *)(local_80.fds_bits + 7),(int *)((long)local_80.fds_bits + 0x34));
    QPoint::QPoint((QPoint *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                   in_stack_fffffffffffffef8);
    local_80.fds_bits[3] = (__fd_mask)&DAT_aaaaaaaaaaaaaaaa;
    local_80.fds_bits[4] = (__fd_mask)&DAT_aaaaaaaaaaaaaaaa;
    local_80.fds_bits[5] = (__fd_mask)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*in_RDI + 0x1f0))
              (local_80.fds_bits + 3,in_RDI,(undefined1 *)((long)local_80.fds_bits + 0x6c));
    local_80.fds_bits[0] = (__fd_mask)&DAT_aaaaaaaaaaaaaaaa;
    local_80.fds_bits[1] = (__fd_mask)&DAT_aaaaaaaaaaaaaaaa;
    local_80.fds_bits[2] = (__fd_mask)&DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*in_RDI + 0x1f0))(&local_80,in_RDI,(undefined1 *)((long)local_80.fds_bits + 0x4c));
    bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffff00);
    if ((bVar1) || (bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffff00), bVar1))
    {
      bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffff00);
      if ((!bVar1) &&
         (bVar1 = QList<QTreeViewItem>::isEmpty((QList<QTreeViewItem> *)0x8fc8c7), !bVar1)) {
        pQVar5 = QList<QTreeViewItem>::constFirst((QList<QTreeViewItem> *)in_stack_ffffffffffffff00)
        ;
        local_80.fds_bits[3] = *(__fd_mask *)&pQVar5->index;
        local_80.fds_bits[4] = (pQVar5->index).i;
        local_80.fds_bits[5] = (__fd_mask)(pQVar5->index).m.ptr;
      }
      bVar1 = QModelIndex::isValid((QModelIndex *)in_stack_ffffffffffffff00);
      if ((!bVar1) &&
         (bVar1 = QList<QTreeViewItem>::isEmpty((QList<QTreeViewItem> *)0x8fc925), !bVar1)) {
        in_stack_ffffffffffffff00 = (QAbstractItemViewPrivate *)this_00->header;
        QHeaderView::count((QHeaderView *)in_stack_ffffffffffffff00);
        QHeaderView::logicalIndex
                  ((QHeaderView *)CONCAT44(arow,acolumn),
                   (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
        local_a0 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        local_90.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar5 = QList<QTreeViewItem>::constLast
                           ((QList<QTreeViewItem> *)
                            CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        local_a0._0_4_ = (pQVar5->index).r;
        local_a0._4_4_ = (pQVar5->index).c;
        local_98 = (undefined1 *)(pQVar5->index).i;
        local_90.ptr = (pQVar5->index).m.ptr;
        QModelIndex::row((QModelIndex *)&local_a0);
        QModelIndex::sibling((QModelIndex *)CONCAT44(iVar7,iVar6),arow,acolumn);
        local_80.fds_bits[0] = (__fd_mask)local_b8;
        local_80.fds_bits[1] = (__fd_mask)local_b0;
        local_80.fds_bits[2] = (__fd_mask)local_a8;
      }
      bVar1 = QAbstractItemViewPrivate::isIndexEnabled
                        (in_stack_ffffffffffffff00,
                         (QModelIndex *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if ((bVar1) &&
         (bVar1 = QAbstractItemViewPrivate::isIndexEnabled
                            (in_stack_ffffffffffffff00,
                             (QModelIndex *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)), bVar1))
      {
        QTreeViewPrivate::select
                  (this_00,(int)&local_80 + 0x18,&local_80,
                   (fd_set *)(ulong)local_80.fds_bits[0xe]._4_4_,in_R8,in_R9);
      }
    }
    else {
      local_84.super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i =
           (QFlagsStorage<QItemSelectionModel::SelectionFlag>)
           QFlags<QItemSelectionModel::SelectionFlag>::operator&
                     ((QFlags<QItemSelectionModel::SelectionFlag> *)in_stack_ffffffffffffff00,
                      in_stack_fffffffffffffefc);
      IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_84);
      if (IVar2 != 0) {
        pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff00);
        (**(code **)(*(long *)pQVar3 + 0x78))();
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_80.fds_bits[0xf]) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::setSelection(const QRect &rect, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QTreeView);
    if (!selectionModel() || rect.isNull())
        return;

    d->executePostedLayout();
    QPoint tl(isRightToLeft() ? qMax(rect.left(), rect.right())
              : qMin(rect.left(), rect.right()), qMin(rect.top(), rect.bottom()));
    QPoint br(isRightToLeft() ? qMin(rect.left(), rect.right()) :
              qMax(rect.left(), rect.right()), qMax(rect.top(), rect.bottom()));
    QModelIndex topLeft = indexAt(tl);
    QModelIndex bottomRight = indexAt(br);
    if (!topLeft.isValid() && !bottomRight.isValid()) {
        if (command & QItemSelectionModel::Clear)
            selectionModel()->clear();
        return;
    }
    if (!topLeft.isValid() && !d->viewItems.isEmpty())
        topLeft = d->viewItems.constFirst().index;
    if (!bottomRight.isValid() && !d->viewItems.isEmpty()) {
        const int column = d->header->logicalIndex(d->header->count() - 1);
        const QModelIndex index = d->viewItems.constLast().index;
        bottomRight = index.sibling(index.row(), column);
    }

    if (!d->isIndexEnabled(topLeft) || !d->isIndexEnabled(bottomRight))
        return;

    d->select(topLeft, bottomRight, command);
}